

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

xmlChar * xmlUTF8Strsub(xmlChar *utf,int start,int len)

{
  byte bVar1;
  int iVar2;
  xmlChar *pxVar3;
  
  if ((len | start) < 0 || utf == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  if (0 < start) {
    iVar2 = 0;
    do {
      bVar1 = *utf;
      if (bVar1 == 0) {
        return (xmlChar *)0x0;
      }
      utf = utf + 1;
      if ((char)bVar1 < '\0') {
        if ((~bVar1 & 0xc0) != 0) {
          return (xmlChar *)0x0;
        }
        if ((bVar1 & 0x40) != 0) {
          return (xmlChar *)0x0;
        }
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != start);
  }
  pxVar3 = xmlUTF8Strndup(utf,len);
  return pxVar3;
}

Assistant:

xmlChar *
xmlUTF8Strsub(const xmlChar *utf, int start, int len) {
    int i;
    int ch;

    if (utf == NULL) return(NULL);
    if (start < 0) return(NULL);
    if (len < 0) return(NULL);

    /*
     * Skip over any leading chars
     */
    for (i = 0;i < start;i++) {
        if ((ch=*utf++) == 0) return(NULL);
        if ( ch & 0x80 ) {
            /* if not simple ascii, verify proper format */
            if ( (ch & 0xc0) != 0xc0 )
                return(NULL);
            /* then skip over remaining bytes for this char */
            while ( (ch <<= 1) & 0x80 )
                if ( (*utf++ & 0xc0) != 0x80 )
                    return(NULL);
        }
    }

    return(xmlUTF8Strndup(utf, len));
}